

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lritdump.cc
# Opt level: O0

int json(Options *opts,string *name)

{
  ostream *this;
  File file;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_00000208;
  ostream *in_stack_00000210;
  string *in_stack_00000298;
  File *in_stack_000002a0;
  File *this_00;
  File *in_stack_ffffffffffffff98;
  
  this_00 = (File *)&stack0xffffffffffffff58;
  lrit::File::File(in_stack_000002a0,in_stack_00000298);
  lrit::toJSON_abi_cxx11_(in_stack_ffffffffffffff98);
  this = nlohmann::operator<<(in_stack_00000210,in_stack_00000208);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)this_00);
  lrit::File::~File(this_00);
  return 0;
}

Assistant:

int json(const Options& opts, const std::string& name) {
  auto file = lrit::File(name);
  std::cout << toJSON(file) << std::endl;
  return 0;
}